

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::tydra::(anonymous_namespace)::ConvertTexTransform2d_abi_cxx11_
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Stage *stage,Path *tx_abs_path,
          UsdTransform2d *tx,UVTexture *tex_out,double timecode)

{
  ulong *puVar1;
  size_type *psVar2;
  byte bVar3;
  size_type sVar4;
  long lVar5;
  vtable_type *pvVar6;
  size_type sVar7;
  undefined8 uVar8;
  Prim *prim;
  bool bVar9;
  int iVar10;
  Shader *pSVar11;
  UsdPrimvarReader<std::array<float,_2UL>_> *pUVar12;
  Token *pTVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  StringData *pSVar15;
  long *plVar16;
  Path *args;
  string *err_00;
  matrix3f *pmVar17;
  char *pcVar18;
  matrix3f *pmVar19;
  optional<tinyusdz::Path::PathType> *poVar20;
  char *pcVar21;
  ulong uVar22;
  size_type *psVar23;
  UsdTransform2d *args_1;
  float fVar24;
  mat3 s;
  mat3 r;
  float rotation;
  mat3 t;
  Prim *pprim;
  float2 scale;
  string prop_part;
  float2 translation;
  string prim_part;
  string varname;
  string err;
  TerminalAttributeValue attr;
  matrix3f ret_1;
  matrix3f ret;
  undefined1 local_3e8 [32];
  undefined4 uStack_3c8;
  undefined1 local_3c0 [24];
  long lStack_3a8;
  float local_3a0;
  float local_39c;
  undefined1 local_398 [32];
  float local_378;
  Prim *local_370;
  array<float,_2UL> local_368;
  long *local_360 [2];
  long local_350 [2];
  double local_340;
  array<float,_2UL> local_338;
  undefined1 local_330 [32];
  UsdTransform2d *local_310;
  matrix3f *local_308;
  long local_300;
  undefined1 local_2f8 [16];
  string local_2e8;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [24];
  float local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined **local_288;
  bool local_280;
  storage_t<tinyusdz::Interpolation> local_27c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  bool local_268;
  undefined1 local_260 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_238;
  undefined1 local_228 [48];
  bool local_1f8;
  storage_t<double> local_1f0;
  bool local_1e8;
  storage_t<tinyusdz::Token> local_1e0;
  bool local_1c0;
  storage_t<tinyusdz::Token> local_1b8;
  bool local_198;
  storage_t<tinyusdz::Token> local_190;
  bool local_170;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_168;
  bool local_138;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  bool local_110;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  bool local_e8;
  storage_t<tinyusdz::Token> local_e0;
  _Rb_tree_node_base local_b8;
  size_t local_98;
  pointer pSStack_90;
  pointer local_88;
  pointer pSStack_80;
  undefined1 local_78 [32];
  float local_58;
  value local_54 [36];
  
  psVar2 = &tx_abs_path[2]._variant_part_str._M_string_length;
  psVar23 = (size_type *)((long)&tx_abs_path[2]._element.field_2 + 8);
  if ((char)tx_abs_path[0xe]._variant_part_str._M_string_length != '\0') {
    psVar23 = psVar2;
  }
  args = tx_abs_path;
  args_1 = tx;
  local_340 = timecode;
  bVar9 = Animatable<float>::get((Animatable<float> *)(psVar23 + 0x139),timecode,&local_39c,Linear);
  if (bVar9) {
    poVar20 = &tx_abs_path[2]._path_type;
    if (*(char *)&tx_abs_path[0x11]._element._M_dataplus._M_p != '\0') {
      poVar20 = (optional<tinyusdz::Path::PathType> *)psVar2;
    }
    local_310 = tx;
    bVar9 = Animatable<std::array<float,_2UL>_>::get
                      ((Animatable<std::array<float,_2UL>_> *)(poVar20 + 0x18a),local_340,&local_368
                       ,Linear);
    if (bVar9) {
      poVar20 = &tx_abs_path[2]._path_type;
      if (tx_abs_path[0x14]._valid != false) {
        poVar20 = (optional<tinyusdz::Path::PathType> *)psVar2;
      }
      bVar9 = Animatable<std::array<float,_2UL>_>::get
                        ((Animatable<std::array<float,_2UL>_> *)(poVar20 + 0x1dd),local_340,
                         &local_338,Linear);
      if (bVar9) {
        bVar3 = tx_abs_path[0xb]._variant_part_str.field_2._M_local_buf[8];
        if ((((bVar3 == 0) &&
             (*(char *)&tx_abs_path[0xb]._variant_selection_part._M_dataplus._M_p == '\0')) &&
            (tx_abs_path[0xb]._variant_part.field_2._M_allocated_capacity ==
             tx_abs_path[0xb]._variant_part._M_string_length)) &&
           (*(char *)&tx_abs_path[0xc]._prim_part._M_dataplus._M_p == '\0')) {
          local_2c8._0_8_ = "`inputs:in` must be authored.\n";
LAB_003581ef:
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<const_char_*,_0>
                    (__return_storage_ptr__,(unexpected_type<const_char_*> *)local_2c8);
          return __return_storage_ptr__;
        }
        plVar16 = (long *)tx_abs_path[0xb]._variant_part._M_string_length;
        if (((long *)tx_abs_path[0xb]._variant_part.field_2._M_allocated_capacity != plVar16 & bVar3
            ) == 0) {
          local_2c8._0_8_ = "`inputs:in` must be a connection.\n";
          goto LAB_003581ef;
        }
        if (tx_abs_path[0xb]._variant_part.field_2._M_allocated_capacity - (long)plVar16 != 0xd0) {
          local_2c8._0_8_ = "`inputs:in` must be a single connection Path.\n";
          goto LAB_003581ef;
        }
        local_330._0_8_ = local_330 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_330,*plVar16,plVar16[1] + *plVar16);
        sVar4 = tx_abs_path[0xb]._variant_part._M_string_length;
        local_360[0] = local_350;
        lVar5 = *(long *)(sVar4 + 0x20);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_360,lVar5,*(long *)(sVar4 + 0x28) + lVar5);
        iVar10 = ::std::__cxx11::string::compare((char *)local_360);
        if (iVar10 == 0) {
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          local_2e8._M_string_length = 0;
          local_2e8.field_2._M_local_buf[0] = '\0';
          local_370 = (Prim *)0x0;
          local_3e8._0_8_ = (matrix3f *)(local_3e8 + 0x10);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"");
          Path::Path((Path *)local_2c8,(string *)local_330,(string *)local_3e8);
          err_00 = &local_2e8;
          bVar9 = Stage::find_prim_at_path((Stage *)this,(Path *)local_2c8,&local_370,err_00);
          Path::~Path((Path *)local_2c8);
          if ((matrix3f *)local_3e8._0_8_ != (matrix3f *)(local_3e8 + 0x10)) {
            operator_delete((void *)local_3e8._0_8_,CONCAT44(local_3e8._20_4_,local_3e8._16_4_) + 1)
            ;
          }
          if (bVar9) {
            pmVar17 = (matrix3f *)(local_3e8 + 0x10);
            if (local_370 == (Prim *)0x0) {
              local_3c0._0_8_ = local_3c0 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3c0,"[InternalError] Prim is nullptr: {}\n","");
              fmt::format<std::__cxx11::string>
                        ((string *)local_3e8,(fmt *)local_3c0,(string *)local_330,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err_00
                        );
              local_2c8._0_8_ = local_3e8._0_8_;
LAB_003586c3:
              if ((matrix3f *)local_2c8._0_8_ == pmVar17) {
                local_2b8._8_8_ = CONCAT44(local_3e8._28_4_,local_3e8._24_4_);
                local_2c8._0_8_ = (matrix3f *)local_2b8;
              }
              local_2b8._4_4_ = local_3e8._20_4_;
              local_2b8._0_4_ = local_3e8._16_4_;
              (__return_storage_ptr__->contained).
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value = false;
              puVar1 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        .field_0 + 0x10);
              *(ulong **)
               &(__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0 = puVar1;
              if ((matrix3f *)local_2c8._0_8_ == (matrix3f *)local_2b8) {
                *puVar1 = local_2b8._0_8_;
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x18) = local_2b8._8_8_;
              }
              else {
                (__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0.m_error._M_dataplus._M_p = (pointer)local_2c8._0_8_;
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x10) = local_2b8._0_8_;
              }
              (__return_storage_ptr__->contained).
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_string_length = CONCAT44(local_3e8._12_4_,local_3e8._8_4_);
              goto LAB_00358604;
            }
            pSVar11 = tinyusdz::value::Value::as<tinyusdz::Shader>(&local_370->_data,false);
            if (pSVar11 == (Shader *)0x0) {
              local_3c0._0_8_ = local_3c0 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3c0,"{} must be Shader Prim, but got {}\n","");
              fmt::format<std::__cxx11::string,std::__cxx11::string>
                        ((string *)local_3e8,(fmt *)local_3c0,(string *)local_330,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_370->_prim_type_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              local_2c8._0_8_ = local_3e8._0_8_;
              goto LAB_003586c3;
            }
            pUVar12 = tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                                (&pSVar11->value,false);
            prim = local_370;
            if (pUVar12 == (UsdPrimvarReader<std::array<float,_2UL>_> *)0x0) {
              local_3c0._0_8_ = (matrix3f *)(local_3c0 + 0x10);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3c0,
                         "Shader {} must be UsdPrimvarReader_float2 type, but got {}(internal type {})\n"
                         ,"");
              pvVar6 = (pSVar11->value).v_.vtable;
              if (pvVar6 == (vtable_type *)0x0) {
                local_398._0_8_ = local_398 + 0x10;
                local_398._8_8_ = 4;
                local_398._16_5_ = 0x64696f76;
              }
              else {
                (*pvVar6->type_name)((string *)local_398);
              }
              fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        ((string *)local_3e8,(fmt *)local_3c0,(string *)local_330,&pSVar11->info_id,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_398,&tex_out->prim_name);
              local_2c8._0_8_ = local_3e8._0_8_;
              if ((matrix3f *)local_3e8._0_8_ == pmVar17) {
                local_2b8._8_8_ = CONCAT44(local_3e8._28_4_,local_3e8._24_4_);
                local_2c8._0_8_ = (matrix3f *)local_2b8;
              }
              local_2b8._4_4_ = local_3e8._20_4_;
              local_2b8._0_4_ = local_3e8._16_4_;
              local_3e8._16_4_ = local_3e8._16_4_ & 0xffffff00;
              (__return_storage_ptr__->contained).
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value = false;
              puVar1 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        .field_0 + 0x10);
              *(ulong **)
               &(__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0 = puVar1;
              if ((matrix3f *)local_2c8._0_8_ == (matrix3f *)local_2b8) {
                *puVar1 = local_2b8._0_8_;
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x18) = local_2b8._8_8_;
              }
              else {
                (__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0.m_error._M_dataplus._M_p = (pointer)local_2c8._0_8_;
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x10) = local_2b8._0_8_;
              }
              (__return_storage_ptr__->contained).
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_string_length = CONCAT44(local_3e8._12_4_,local_3e8._8_4_);
              local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffffffffff00;
              local_2c8._8_8_ = (pointer)0x0;
              local_3e8._12_4_ = 0;
              local_3e8._8_4_ = 0;
              local_2c8._0_8_ = (matrix3f *)local_2b8;
              local_3e8._0_8_ = pmVar17;
              if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
              }
              uVar22 = local_3c0._16_8_;
              pmVar17 = (matrix3f *)local_3c0._0_8_;
              if ((matrix3f *)local_3c0._0_8_ == (matrix3f *)(local_3c0 + 0x10)) goto LAB_0035861b;
              goto LAB_00358613;
            }
            local_308 = (matrix3f *)local_2f8;
            local_300 = 0;
            local_2f8[0] = 0;
            local_2c8._8_8_ = local_2b8 + 8;
            local_2c8[0] = 1;
            local_2b8._0_8_ = 0;
            local_2b8._8_8_ = local_2b8._8_8_ & 0xffffffffffffff00;
            local_2a0 = 0.0;
            local_288 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_298._M_allocated_capacity = 0;
            local_280 = false;
            local_27c = (storage_t<tinyusdz::Interpolation>)0x0;
            local_278._M_local_buf[0] = '\0';
            local_278._M_allocated_capacity._4_4_ = 0;
            local_278._8_2_ = 0;
            local_268 = false;
            local_1f0 = (storage_t<double>)0x0;
            local_1e8 = false;
            local_e0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_e0._8_8_ = 0;
            local_e0._16_8_ = 0;
            local_e0._24_8_ = 0;
            local_b8._M_left = &local_b8;
            local_b8._M_color = _S_red;
            local_b8._M_parent = (_Base_ptr)0x0;
            aStack_238._M_local_buf[8] = '\0';
            local_260._32_8_ = 0;
            aStack_238._M_allocated_capacity = 0;
            local_260._16_8_ = 0;
            local_260._24_8_ = (pointer)0x0;
            local_260._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_260._8_8_ = 0;
            local_228._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_228._8_8_ = 0;
            local_228._16_8_ = 0;
            local_228._24_8_ = 0;
            local_228[0x20] = false;
            local_228._33_3_ = 0;
            local_228._36_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
            local_228._40_8_ = 0;
            local_1f8 = false;
            local_1e0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_1e0._8_8_ = 0;
            local_1e0._16_8_ = 0;
            local_1e0._24_8_ = 0;
            local_1c0 = false;
            local_1b8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_1b8._8_8_ = 0;
            local_1b8._16_8_ = 0;
            local_1b8._24_8_ = 0;
            local_198 = false;
            local_190.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_190._8_8_ = 0;
            local_190._16_8_ = 0;
            local_190._24_8_ = 0;
            local_170 = false;
            local_168.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_168._8_8_ = 0;
            local_168._16_8_ = 0;
            local_168._24_8_ = 0;
            local_168._32_8_ = 0;
            local_168._40_8_ = 0;
            local_138 = false;
            local_110 = false;
            local_130._16_8_ = 0;
            local_130._24_8_ = 0;
            local_130.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_130._8_8_ = 0;
            local_e8 = false;
            local_108._16_8_ = 0;
            local_108._24_8_ = 0;
            local_108.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_108._8_8_ = 0;
            local_98 = 0;
            pSStack_90 = (pointer)0x0;
            local_88 = (pointer)0x0;
            pSStack_80 = (pointer)0x0;
            local_b8._M_right = local_b8._M_left;
            local_3e8._0_8_ = pmVar17;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3e8,"inputs:varname","");
            bVar9 = EvaluateAttribute((Stage *)this,prim,(string *)local_3e8,
                                      (TerminalAttributeValue *)local_2c8,&local_2e8,NAN,Linear);
            if ((matrix3f *)local_3e8._0_8_ != pmVar17) {
              operator_delete((void *)local_3e8._0_8_,
                              CONCAT44(local_3e8._20_4_,local_3e8._16_4_) + 1);
            }
            if (bVar9) {
              if ((bool)local_2c8[0] == false) {
                pTVar13 = tinyusdz::value::Value::as<tinyusdz::Token>((Value *)&local_298,false);
              }
              else {
                pTVar13 = (Token *)0x0;
              }
              if (pTVar13 == (Token *)0x0) {
                if ((bool)local_2c8[0] == false) {
                  pbVar14 = tinyusdz::value::Value::as<std::__cxx11::string>
                                      ((Value *)&local_298,false);
                }
                else {
                  pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                  ;
                }
                if (pbVar14 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                goto LAB_00358a72;
                if ((bool)local_2c8[0] == false) {
                  pSVar15 = tinyusdz::value::Value::as<tinyusdz::value::StringData>
                                      ((Value *)&local_298,false);
                }
                else {
                  pSVar15 = (StringData *)0x0;
                }
                if (pSVar15 == (StringData *)0x0) {
                  TerminalAttributeValue::type_name_abi_cxx11_
                            ((string *)local_78,(TerminalAttributeValue *)local_2c8);
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_398,
                                   "`inputs:varname` must be `token` or `string` type, but got ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_78);
                  plVar16 = (long *)::std::__cxx11::string::append((char *)local_398);
                  pmVar17 = (matrix3f *)(local_3c0 + 0x10);
                  pmVar19 = (matrix3f *)(plVar16 + 2);
                  if ((matrix3f *)*plVar16 == pmVar19) {
                    local_3c0._16_8_ = *(undefined8 *)pmVar19->m[0];
                    lStack_3a8 = plVar16[3];
                    local_3c0._0_8_ = pmVar17;
                  }
                  else {
                    local_3c0._16_8_ = *(undefined8 *)pmVar19->m[0];
                    local_3c0._0_8_ = (matrix3f *)*plVar16;
                  }
                  uVar8 = local_3c0._16_8_;
                  sVar7 = plVar16[1];
                  *plVar16 = (long)pmVar19;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  local_3e8._20_4_ = SUB84(local_3c0._16_8_,4);
                  if ((matrix3f *)local_3c0._0_8_ == pmVar17) {
                    local_3e8._24_4_ = (undefined4)lStack_3a8;
                    local_3e8._28_4_ = (undefined4)((ulong)lStack_3a8 >> 0x20);
                    local_3c0._0_8_ = (matrix3f *)(local_3e8 + 0x10);
                  }
                  local_3c0._16_8_ = local_3c0._16_8_ & 0xffffffffffffff00;
                  (__return_storage_ptr__->contained).
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value = false;
                  puVar1 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            .field_0 + 0x10);
                  *(ulong **)
                   &(__return_storage_ptr__->contained).
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0 = puVar1;
                  if ((matrix3f *)local_3c0._0_8_ == (matrix3f *)(local_3e8 + 0x10)) {
                    *puVar1 = uVar8;
                    *(ulong *)((long)&(__return_storage_ptr__->contained).
                                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      .field_0 + 0x18) = CONCAT44(local_3e8._28_4_,local_3e8._24_4_)
                    ;
                  }
                  else {
                    (__return_storage_ptr__->contained).
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .field_0.m_error._M_dataplus._M_p = (pointer)local_3c0._0_8_;
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->contained).
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .field_0 + 0x10) = uVar8;
                  }
                  (__return_storage_ptr__->contained).
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0.m_error._M_string_length = sVar7;
                  local_3e8._0_8_ = local_3e8 + 0x10;
                  local_3e8._17_3_ = SUB83(uVar8,1);
                  local_3e8._16_4_ = (uint)(uint3)local_3e8._17_3_ << 8;
                  local_3c0._8_8_ = 0;
                  local_3e8._12_4_ = 0;
                  local_3e8._8_4_ = 0;
                  local_3c0._0_8_ = pmVar17;
                  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                    operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
                  }
                  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
                    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
                  }
                }
                else {
                  ::std::__cxx11::string::_M_assign((string *)&local_308);
                }
                if (pSVar15 == (StringData *)0x0) goto LAB_00358c66;
              }
              else {
LAB_00358a72:
                ::std::__cxx11::string::_M_assign((string *)&local_308);
              }
              if (local_300 == 0) {
                local_3e8._0_4_ = 0x611a45;
                local_3e8._4_4_ = 0;
                nonstd::expected_lite::
                expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::expected<const_char_*,_0>
                          (__return_storage_ptr__,(unexpected_type<const_char_*> *)local_3e8);
              }
              else {
                local_3e8._4_4_ = 0;
                local_3e8._8_4_ = 0;
                local_3e8._12_4_ = 0;
                local_3e8._20_4_ = 0;
                local_3e8._24_4_ = 0;
                local_3e8._28_4_ = 0;
                uStack_3c8 = 0x3f800000;
                local_3e8._0_4_ = local_368._M_elems[0];
                local_3e8._16_4_ = local_368._M_elems[1];
                local_3c0._0_4_ = 1.0;
                local_3c0._4_4_ = 0.0;
                local_3c0._8_4_ = 0.0;
                local_3c0._12_4_ = 0.0;
                local_3c0._16_4_ = 1.0;
                local_3c0._20_4_ = 0.0;
                lStack_3a8 = 0;
                local_3a0 = 1.0;
                fVar24 = cosf((local_39c * 3.141592) / 180.0);
                local_3c0._0_4_ = fVar24;
                fVar24 = sinf((local_39c * 3.141592) / 180.0);
                local_3c0._4_4_ = fVar24;
                fVar24 = sinf((local_39c * 3.141592) / 180.0);
                local_3c0._8_8_ = CONCAT44(fVar24,local_3c0._8_4_) ^ 0x8000000000000000;
                fVar24 = cosf((local_39c * 3.141592) / 180.0);
                local_3c0._16_4_ = fVar24;
                local_398._0_8_ = (pointer)0x3f800000;
                local_398._8_8_ = 0;
                local_398._16_8_ = 0x3f800000;
                local_378 = 1.0;
                local_398._24_4_ = local_338._M_elems[0];
                local_398._28_4_ = local_338._M_elems[1];
                tinyusdz::value::Mult<tinyusdz::value::matrix3f,float,3ul>
                          ((matrix3f *)local_54,(value *)local_3e8,(matrix3f *)local_3c0,pmVar17);
                tinyusdz::value::Mult<tinyusdz::value::matrix3f,float,3ul>
                          ((matrix3f *)local_78,local_54,(matrix3f *)local_398,pmVar17);
                *(float *)&(local_310->super_ShaderNode).super_UsdShadePrim.meta.comment.field_0x4 =
                     local_58;
                *(undefined8 *)
                 ((long)&(local_310->super_ShaderNode).super_UsdShadePrim.meta.doc.contained + 0x24)
                     = local_78._16_8_;
                *(undefined8 *)
                 ((long)&(local_310->super_ShaderNode).super_UsdShadePrim.meta.doc.contained + 0x2c)
                     = local_78._24_8_;
                *(undefined8 *)
                 ((long)&(local_310->super_ShaderNode).super_UsdShadePrim.meta.doc.contained + 0x14)
                     = local_78._0_8_;
                *(undefined8 *)
                 ((long)&(local_310->super_ShaderNode).super_UsdShadePrim.meta.doc.contained + 0x1c)
                     = local_78._8_8_;
                *(float *)&(local_310->super_ShaderNode).super_UsdShadePrim.meta.comment.contained =
                     local_39c;
                *(_Type *)((long)&(local_310->super_ShaderNode).super_UsdShadePrim.meta.comment.
                                  contained + 0xc) = local_338._M_elems;
                *(ulong *)((long)&(local_310->super_ShaderNode).super_UsdShadePrim.meta.comment.
                                  contained + 4) =
                     CONCAT44(local_368._M_elems[1],local_368._M_elems[0]);
                *(undefined1 *)
                 ((long)&(local_310->super_ShaderNode).super_UsdShadePrim.meta.doc.contained + 0x10)
                     = 1;
                ::std::__cxx11::string::_M_assign
                          ((string *)
                           ((long)&(local_310->super_ShaderNode).super_UsdShadePrim.meta.comment.
                                   contained + 0x18));
                (__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value = true;
                (__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0.m_value = true;
              }
            }
            else {
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_398,"`inputs:varname` evaluation failed: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_2e8);
              plVar16 = (long *)::std::__cxx11::string::append((char *)local_398);
              pmVar17 = (matrix3f *)(local_3c0 + 0x10);
              pmVar19 = (matrix3f *)(plVar16 + 2);
              local_3e8._0_8_ = local_3e8 + 0x10;
              if ((matrix3f *)*plVar16 == pmVar19) {
                local_3c0._16_8_ = *(undefined8 *)pmVar19->m[0];
                lStack_3a8 = plVar16[3];
                local_3c0._0_8_ = pmVar17;
              }
              else {
                local_3c0._16_8_ = *(undefined8 *)pmVar19->m[0];
                local_3c0._0_8_ = (matrix3f *)*plVar16;
              }
              uVar8 = local_3c0._16_8_;
              sVar7 = plVar16[1];
              *plVar16 = (long)pmVar19;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              local_3e8._20_4_ = SUB84(local_3c0._16_8_,4);
              if ((matrix3f *)local_3c0._0_8_ == pmVar17) {
                local_3e8._24_4_ = (undefined4)lStack_3a8;
                local_3e8._28_4_ = (undefined4)((ulong)lStack_3a8 >> 0x20);
                local_3c0._0_8_ = local_3e8._0_8_;
              }
              local_3c0._16_8_ = local_3c0._16_8_ & 0xffffffffffffff00;
              (__return_storage_ptr__->contained).
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_has_value = false;
              puVar1 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        .field_0 + 0x10);
              *(ulong **)
               &(__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0 = puVar1;
              if (local_3c0._0_8_ == local_3e8._0_8_) {
                *puVar1 = uVar8;
                *(ulong *)((long)&(__return_storage_ptr__->contained).
                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  .field_0 + 0x18) = CONCAT44(local_3e8._28_4_,local_3e8._24_4_);
              }
              else {
                *(undefined8 *)
                 &(__return_storage_ptr__->contained).
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0 = local_3c0._0_8_;
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x10) = uVar8;
              }
              (__return_storage_ptr__->contained).
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_string_length = sVar7;
              local_3e8._17_3_ = SUB83(uVar8,1);
              local_3e8._16_4_ = (uint)(uint3)local_3e8._17_3_ << 8;
              local_3c0._8_8_ = 0;
              local_3e8._12_4_ = 0;
              local_3e8._8_4_ = 0;
              local_3c0._0_8_ = pmVar17;
              if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
              }
            }
LAB_00358c66:
            TerminalAttributeValue::~TerminalAttributeValue((TerminalAttributeValue *)local_2c8);
            if (local_308 != (matrix3f *)local_2f8) {
              uVar22 = CONCAT71(local_2f8._1_7_,local_2f8[0]);
              pmVar17 = local_308;
              goto LAB_00358613;
            }
          }
          else {
            local_3c0._0_8_ = local_3c0 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3c0,
                       "`inputs:in` connection Path not found in the Stage. {}\n","");
            fmt::format<std::__cxx11::string>
                      ((string *)local_3e8,(fmt *)local_3c0,(string *)local_330,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err_00);
            local_2c8._0_8_ = local_3e8._0_8_;
            if ((matrix3f *)local_3e8._0_8_ == (matrix3f *)(local_3e8 + 0x10)) {
              local_2b8._8_8_ = CONCAT44(local_3e8._28_4_,local_3e8._24_4_);
              local_2c8._0_8_ = (matrix3f *)local_2b8;
            }
            local_2b8._4_4_ = local_3e8._20_4_;
            local_2b8._0_4_ = local_3e8._16_4_;
            (__return_storage_ptr__->contained).
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value = false;
            puVar1 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      .field_0 + 0x10);
            *(ulong **)
             &(__return_storage_ptr__->contained).
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0 = puVar1;
            if ((matrix3f *)local_2c8._0_8_ == (matrix3f *)local_2b8) {
              *puVar1 = local_2b8._0_8_;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->contained).
                       super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0 + 0x18) = local_2b8._8_8_;
            }
            else {
              (__return_storage_ptr__->contained).
              super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.m_error._M_dataplus._M_p = (pointer)local_2c8._0_8_;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->contained).
                       super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0 + 0x10) = local_2b8._0_8_;
            }
            (__return_storage_ptr__->contained).
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_error._M_string_length = CONCAT44(local_3e8._12_4_,local_3e8._8_4_);
LAB_00358604:
            local_3e8._0_8_ = local_3e8 + 0x10;
            local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffffffffff00;
            local_2c8._8_8_ = (pointer)0x0;
            local_2c8._0_8_ = local_2b8;
            local_3e8._16_4_ = local_3e8._16_4_ & 0xffffff00;
            local_3e8._12_4_ = 0;
            local_3e8._8_4_ = 0;
            uVar22 = local_3c0._16_8_;
            pmVar17 = (matrix3f *)local_3c0._0_8_;
            if ((matrix3f *)local_3c0._0_8_ != (matrix3f *)(local_3c0 + 0x10)) {
LAB_00358613:
              operator_delete(pmVar17,uVar22 + 1);
            }
          }
LAB_0035861b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,
                            CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                     local_2e8.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          local_2c8._0_8_ =
               "`inputs:in` connection Path\'s property part must be `outputs:result`\n";
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::expected<const_char_*,_0>
                    (__return_storage_ptr__,(unexpected_type<const_char_*> *)local_2c8);
        }
        if (local_360[0] != local_350) {
          operator_delete(local_360[0],local_350[0] + 1);
        }
        pmVar17 = (matrix3f *)local_330._0_8_;
        if ((matrix3f *)local_330._0_8_ == (matrix3f *)(local_330 + 0x10)) {
          return __return_storage_ptr__;
        }
        goto LAB_003581c2;
      }
      pcVar21 = "Failed to retrieve translation attribute from {}\n";
      pcVar18 = "";
    }
    else {
      pcVar21 = "Failed to retrieve scale attribute from {}\n";
      pcVar18 = "";
    }
  }
  else {
    pcVar21 = "Failed to retrieve rotation attribute from {}\n";
    pcVar18 = "";
  }
  local_3c0._0_8_ = (matrix3f *)(local_3c0 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,pcVar21,pcVar18);
  Path::full_path_name_abi_cxx11_((string *)local_398,(Path *)stage);
  fmt::format<std::__cxx11::string>
            ((string *)local_3e8,(fmt *)local_3c0,(string *)local_398,&args->_prim_part);
  local_2c8._0_8_ = CONCAT44(local_3e8._4_4_,local_3e8._0_4_);
  local_3e8._0_8_ = local_3e8 + 0x10;
  if (local_2c8._0_8_ == local_3e8._0_8_) {
    local_2b8._8_8_ = CONCAT44(local_3e8._28_4_,local_3e8._24_4_);
    local_2c8._0_8_ = (matrix3f *)local_2b8;
  }
  local_2b8._4_4_ = local_3e8._20_4_;
  local_2b8._0_4_ = local_3e8._16_4_;
  local_3e8._16_4_ = local_3e8._16_4_ & 0xffffff00;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = false;
  puVar1 = (ulong *)((long)&(__return_storage_ptr__->contained).
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .field_0 + 0x10);
  *(ulong **)
   &(__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0 = puVar1;
  if ((matrix3f *)local_2c8._0_8_ == (matrix3f *)local_2b8) {
    *puVar1 = local_2b8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x18) = local_2b8._8_8_;
  }
  else {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_dataplus._M_p = (pointer)local_2c8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x10) = local_2b8._0_8_;
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_error._M_string_length = CONCAT44(local_3e8._12_4_,local_3e8._8_4_);
  local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffffffffff00;
  local_2c8._8_8_ = (pointer)0x0;
  local_3e8._12_4_ = 0;
  local_3e8._8_4_ = 0;
  local_2c8._0_8_ = (matrix3f *)local_2b8;
  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
  }
  local_330._16_8_ = local_3c0._16_8_;
  pmVar17 = (matrix3f *)local_3c0._0_8_;
  if ((matrix3f *)local_3c0._0_8_ == (matrix3f *)(local_3c0 + 0x10)) {
    return __return_storage_ptr__;
  }
LAB_003581c2:
  operator_delete(pmVar17,local_330._16_8_ + 1);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> ConvertTexTransform2d(
    const Stage &stage, const Path &tx_abs_path, const UsdTransform2d &tx,
    UVTexture *tex_out, double timecode) {
  float rotation;  // in angles
  if (!tx.rotation.get_value().get(timecode, &rotation)) {
    return nonstd::make_unexpected(
        fmt::format("Failed to retrieve rotation attribute from {}\n",
                    tx_abs_path.full_path_name()));
  }

  value::float2 scale;
  if (!tx.scale.get_value().get(timecode, &scale)) {
    return nonstd::make_unexpected(
        fmt::format("Failed to retrieve scale attribute from {}\n",
                    tx_abs_path.full_path_name()));
  }

  value::float2 translation;
  if (!tx.translation.get_value().get(timecode, &translation)) {
    return nonstd::make_unexpected(
        fmt::format("Failed to retrieve translation attribute from {}\n",
                    tx_abs_path.full_path_name()));
  }

  // must be authored and connected to PrimvarReader.
  if (!tx.in.authored()) {
    return nonstd::make_unexpected("`inputs:in` must be authored.\n");
  }

  if (!tx.in.is_connection()) {
    return nonstd::make_unexpected("`inputs:in` must be a connection.\n");
  }

  const auto &paths = tx.in.get_connections();
  if (paths.size() != 1) {
    return nonstd::make_unexpected(
        "`inputs:in` must be a single connection Path.\n");
  }

  std::string prim_part = paths[0].prim_part();
  std::string prop_part = paths[0].prop_part();

  if (prop_part != "outputs:result") {
    return nonstd::make_unexpected(
        "`inputs:in` connection Path's property part must be "
        "`outputs:result`\n");
  }

  std::string err;

  const Prim *pprim{nullptr};
  if (!stage.find_prim_at_path(Path(prim_part, ""), pprim, &err)) {
    return nonstd::make_unexpected(fmt::format(
        "`inputs:in` connection Path not found in the Stage. {}\n", prim_part));
  }

  if (!pprim) {
    return nonstd::make_unexpected(
        fmt::format("[InternalError] Prim is nullptr: {}\n", prim_part));
  }

  const Shader *pshader = pprim->as<Shader>();
  if (!pshader) {
    return nonstd::make_unexpected(
        fmt::format("{} must be Shader Prim, but got {}\n", prim_part,
                    pprim->prim_type_name()));
  }

  const UsdPrimvarReader_float2 *preader =
      pshader->value.as<UsdPrimvarReader_float2>();
  if (!preader) {
    return nonstd::make_unexpected(fmt::format(
        "Shader {} must be UsdPrimvarReader_float2 type, but got {}(internal type {})\n",
        prim_part, pshader->info_id, pshader->value.type_name()));
  }

  // Get value producing attribute(i.e, follow .connection and return
  // terminal Attribute value)
  //value::token varname;

  // 'string' for inputs:varname preferred.
  std::string varname;
#if 0
  if (!tydra::EvaluateShaderAttribute(stage, *pshader, "inputs:varname",
                                      &varname, &err)) {
    return nonstd::make_unexpected(
        fmt::format("Failed to evaluate UsdPrimvarReader_float2's "
                    "inputs:varname: {}\n",
                    err));
  }
#else
  TerminalAttributeValue attr;
  if (!tydra::EvaluateAttribute(stage, *pprim, "inputs:varname", &attr, &err)) {
    return nonstd::make_unexpected(
        "`inputs:varname` evaluation failed: " + err + "\n");
  }
  if (auto pvt = attr.as<value::token>()) {
    varname = pvt->str();
  } else if (auto pvs = attr.as<std::string>()) {
    varname = *pvs;
  } else if (auto pvsd = attr.as<value::StringData>()) {
    varname = (*pvsd).value;
  } else {
    return nonstd::make_unexpected(
        "`inputs:varname` must be `token` or `string` type, but got " + attr.type_name() +
        "\n");
  }
  if (varname.empty()) {
    return nonstd::make_unexpected("`inputs:varname` is empty token\n");
  }
  DCOUT("inputs:varname = " << varname);
#endif

  // Build transform matrix.
  // https://github.com/KhronosGroup/glTF/tree/main/extensions/2.0/Khronos/KHR_texture_transform
  // Since USD uses post-multiply,
  //
  // matrix = scale * rotate * translate
  //
  {
    mat3 s;
    s.set_scale(scale[0], scale[1], 1.0f);

    mat3 r = mat3::identity();

    r.m[0][0] = std::cos(math::radian(rotation));
    r.m[0][1] = std::sin(math::radian(rotation));

    r.m[1][0] = -std::sin(math::radian(rotation));
    r.m[1][1] = std::cos(math::radian(rotation));

    mat3 t = mat3::identity();
    t.set_translation(translation[0], translation[1], 1.0f);

    tex_out->transform = s * r * t;
  }

  tex_out->tx_rotation = rotation;
  tex_out->tx_translation = translation;
  tex_out->tx_scale = scale;
  tex_out->has_transform2d = true;

  tex_out->varname_uv = varname;

  return true;
}